

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_xar.c
# Opt level: O3

int rd_contents(archive_read *a,void **buff,size_t *size,size_t *used,uint64_t remaining)

{
  void *pvVar1;
  uint uVar2;
  void *__src;
  void *pvVar3;
  _func_int_archive_md5_ctx_ptr_void_ptr_size_t **pp_Var4;
  long lVar5;
  char *pcVar6;
  int error_number;
  size_t sVar7;
  ulong uVar8;
  ssize_t bytes;
  ulong local_38;
  
  __src = __archive_read_ahead(a,1,(ssize_t *)&local_38);
  if ((long)local_38 < 0) {
    return (int)local_38;
  }
  if (local_38 == 0) {
    pcVar6 = "Truncated archive file";
    error_number = -1;
LAB_0014e7eb:
    archive_set_error(&a->archive,error_number,pcVar6);
    return -0x1e;
  }
  if (remaining < local_38) {
    local_38 = remaining;
  }
  uVar8 = local_38;
  *used = local_38;
  pvVar1 = a->format->data;
  pvVar3 = *buff;
  if (pvVar3 == (void *)0x0) {
    pvVar3 = *(void **)((long)pvVar1 + 0x20);
    if (pvVar3 == (void *)0x0) {
      pvVar3 = malloc(0x10000);
      *(void **)((long)pvVar1 + 0x20) = pvVar3;
      if (pvVar3 == (void *)0x0) {
        pcVar6 = "Couldn\'t allocate memory for out buffer";
        error_number = 0xc;
        goto LAB_0014e7eb;
      }
    }
    *buff = pvVar3;
    sVar7 = 0x10000;
  }
  else {
    sVar7 = *size;
  }
  if (*(int *)((long)pvVar1 + 0x60) - 3U < 2) {
    *(void **)((long)pvVar1 + 0xe0) = __src;
    *(ulong *)((long)pvVar1 + 0xe8) = uVar8;
    *(void **)((long)pvVar1 + 0xf8) = pvVar3;
    *(size_t *)((long)pvVar1 + 0x100) = sVar7;
    uVar2 = lzma_code((long)pvVar1 + 0xe0,0);
    if (uVar2 != 0) {
      if (uVar2 != 1) {
        pcVar6 = "application/x-lzma";
        if (*(int *)((long)pvVar1 + 0x1f8) == 4) {
          pcVar6 = "application/x-xz";
        }
        archive_set_error(&a->archive,-1,"%s decompression failed(%d)",pcVar6 + 0xe,(ulong)uVar2);
        return -0x1e;
      }
      lzma_end((long)pvVar1 + 0xe0);
      *(undefined4 *)((long)pvVar1 + 0x168) = 0;
    }
    *used = uVar8 - *(long *)((long)pvVar1 + 0xe8);
    uVar8 = *(ulong *)((long)pvVar1 + 0x100);
LAB_0014e8e4:
    uVar8 = sVar7 - uVar8;
  }
  else {
    if (*(int *)((long)pvVar1 + 0x60) == 1) {
      *(void **)((long)pvVar1 + 0x68) = __src;
      *(int *)((long)pvVar1 + 0x70) = (int)uVar8;
      *(void **)((long)pvVar1 + 0x80) = pvVar3;
      *(int *)((long)pvVar1 + 0x88) = (int)sVar7;
      uVar2 = inflate((long)pvVar1 + 0x68,0);
      if (1 < uVar2) {
        archive_set_error(&a->archive,-1,"File decompression failed (%d)",(ulong)uVar2);
        return -0x1e;
      }
      *used = uVar8 - *(uint *)((long)pvVar1 + 0x70);
      uVar8 = (ulong)*(uint *)((long)pvVar1 + 0x88);
      goto LAB_0014e8e4;
    }
    if (pvVar3 == *(void **)((long)pvVar1 + 0x20)) {
      *buff = __src;
    }
    else {
      if (sVar7 < uVar8) {
        uVar8 = sVar7;
      }
      memcpy(pvVar3,__src,uVar8);
      *used = uVar8;
    }
  }
  *size = uVar8;
  pvVar1 = *buff;
  pvVar3 = a->format->data;
  if (*(int *)((long)pvVar3 + 0x170) == 1) {
    pp_Var4 = (_func_int_archive_md5_ctx_ptr_void_ptr_size_t **)&__archive_digest.sha1update;
    lVar5 = 0x10;
  }
  else {
    if (*(int *)((long)pvVar3 + 0x170) != 2) goto LAB_0014e961;
    pp_Var4 = &__archive_digest.md5update;
    lVar5 = 8;
  }
  (**pp_Var4)((archive_md5_ctx *)((long)pvVar3 + lVar5 + 0x170),__src,*used);
LAB_0014e961:
  if (*(int *)((long)pvVar3 + 0x188) == 1) {
    pp_Var4 = (_func_int_archive_md5_ctx_ptr_void_ptr_size_t **)&__archive_digest.sha1update;
    lVar5 = 0x10;
  }
  else {
    if (*(int *)((long)pvVar3 + 0x188) != 2) {
      return 0;
    }
    pp_Var4 = &__archive_digest.md5update;
    lVar5 = 8;
  }
  (**pp_Var4)((archive_md5_ctx *)((long)pvVar3 + lVar5 + 0x188),pvVar1,uVar8);
  return 0;
}

Assistant:

static int
rd_contents(struct archive_read *a, const void **buff, size_t *size,
    size_t *used, uint64_t remaining)
{
	const unsigned char *b;
	ssize_t bytes;

	/* Get whatever bytes are immediately available. */
	b = __archive_read_ahead(a, 1, &bytes);
	if (bytes < 0)
		return ((int)bytes);
	if (bytes == 0) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Truncated archive file");
		return (ARCHIVE_FATAL);
	}
	if ((uint64_t)bytes > remaining)
		bytes = (ssize_t)remaining;

	/*
	 * Decompress contents of file.
	 */
	*used = bytes;
	if (decompress(a, buff, size, b, used) != ARCHIVE_OK)
		return (ARCHIVE_FATAL);

	/*
	 * Update checksum of a compressed data and a extracted data.
	 */
	checksum_update(a, b, *used, *buff, *size);

	return (ARCHIVE_OK);
}